

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_es5_conformance.cpp
# Opt level: O2

void test_main(void)

{
  char *pcVar1;
  bool bVar2;
  version vVar3;
  int *piVar4;
  long lVar5;
  unicode *puVar6;
  long lVar7;
  wostream *pwVar8;
  long lVar9;
  runtime_error *prVar10;
  ostream *poVar11;
  char *in_RCX;
  char *pcVar12;
  on_statement_executed_type *poVar13;
  int iVar14;
  string_view in;
  string_view in_00;
  string_view in_01;
  string_view in_02;
  wstring_view wVar15;
  int local_300;
  int local_2fc;
  int *local_2f8;
  value res;
  interpreter interpreter_;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_2b8;
  wstring local_298;
  wstring local_278;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> code;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> helper_code;
  gc_heap h;
  wostringstream woss;
  
  vVar3 = tested_version();
  if (vVar3 == es5) {
    mjs::gc_heap::gc_heap(&h,0x100000);
    in._M_str = in_RCX;
    in._M_len = (size_t)
                "\n// ----------------------------------------------\n// helpers that unittests can use (typically in\n// their prereq function).\n// ----------------------------------------------\nfunction fnExists(/*arguments*/) {\n  for (var i=0; i<arguments.length; i++) {\n     if (typeof(arguments[i]) !== \"function\") return false;\n     }\n  return true;\n}\n\nfunction fnGlobalObject() {\n  return (function () {return this}).call(null);\n  }\n\nfunction compareValues(v1, v2)\n{\n  if (v1 === 0 && v2 === 0)\n    return 1 / v1 === 1 / v2;\n  if (v1 !== v1 && v2 !== v2)\n    return true;\n  return v1 === v2;\n}\n\nfunction isSubsetOf(aSubset, aArray) {\n  if (aArray.length < aSubset.length) {\n    return false;\n  }\n\n  var sortedSubset = [].concat(aSubset).sort();\n  var sortedArray = [].concat(aArray).sort();\n\n  nextSubsetMember:\n  for (var i = 0, j = 0; i < sortedSubset.length; i++) {\n    var v = sortedSubset[i];\n    while (j < sortedArray.length) {\n      if (compareValues(v, sortedArray[j++])) {\n        continue nextSubsetMember;\n      }\n    }\n\n    return false;\n  }\n\n  return true;\n}\n"
    ;
    mjs::unicode::utf8_to_utf16_abi_cxx11_((wstring *)&woss,(unicode *)0x424,in);
    std::operator+(&helper_code,
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &woss,L";");
    std::__cxx11::wstring::~wstring((wstring *)&woss);
    iVar14 = 0;
    local_2fc = 0;
    while( true ) {
      local_300 = iVar14;
      if (0x4d6 < iVar14) break;
      piVar4 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                         (expected_failures,"N3mjs9gc_stringE",&local_300);
      pcVar12 = (char *)(ulong)(h.alloc_context_.capacity_ - h.alloc_context_.start_);
      if (0x32 < (int)(((ulong)(h.alloc_context_.next_free_ - h.alloc_context_.start_) * 100) /
                      (ulong)pcVar12)) {
        mjs::gc_heap::garbage_collect(&h);
      }
      lVar5 = std::chrono::_V2::system_clock::now();
      pcVar1 = tests[iVar14].prelude;
      puVar6 = (unicode *)strlen(pcVar1);
      in_00._M_str = pcVar12;
      in_00._M_len = (size_t)pcVar1;
      local_2f8 = piVar4;
      mjs::unicode::utf8_to_utf16_abi_cxx11_(&local_298,puVar6,in_00);
      std::operator+(&local_2b8,&local_298,&helper_code);
      std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     &res,&local_2b8,L"(function(){");
      pcVar1 = tests[iVar14].code;
      puVar6 = (unicode *)strlen(pcVar1);
      in_01._M_str = pcVar12;
      in_01._M_len = (size_t)pcVar1;
      mjs::unicode::utf8_to_utf16_abi_cxx11_(&local_278,puVar6,in_01);
      std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     &woss,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)&res,&local_278);
      std::operator+(&code,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)&woss,L"})()");
      std::__cxx11::wstring::~wstring((wstring *)&woss);
      std::__cxx11::wstring::~wstring((wstring *)&local_278);
      std::__cxx11::wstring::~wstring((wstring *)&res);
      std::__cxx11::wstring::~wstring((wstring *)&local_2b8);
      std::__cxx11::wstring::~wstring((wstring *)&local_298);
      pcVar1 = tests[iVar14].id;
      puVar6 = (unicode *)strlen(pcVar1);
      in_02._M_str = pcVar12;
      in_02._M_len = (size_t)pcVar1;
      mjs::unicode::utf8_to_utf16_abi_cxx11_
                ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&woss
                 ,puVar6,in_02);
      local_298._M_dataplus._M_p._0_4_ = 2;
      std::make_unique<mjs::source_file,std::__cxx11::wstring,std::__cxx11::wstring&,mjs::version>
                (&local_2b8,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&woss
                 ,(version *)&code);
      std::__shared_ptr<mjs::source_file,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mjs::source_file,std::default_delete<mjs::source_file>,void>
                ((__shared_ptr<mjs::source_file,(__gnu_cxx::_Lock_policy)2> *)&res,
                 (unique_ptr<mjs::source_file,_std::default_delete<mjs::source_file>_> *)&local_2b8)
      ;
      mjs::parse((mjs *)&local_278,(shared_ptr<mjs::source_file> *)&res,non_strict);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&res.field_1.s_);
      std::unique_ptr<mjs::source_file,_std::default_delete<mjs::source_file>_>::~unique_ptr
                ((unique_ptr<mjs::source_file,_std::default_delete<mjs::source_file>_> *)&local_2b8)
      ;
      std::__cxx11::wstring::~wstring((wstring *)&woss);
      lVar7 = std::chrono::_V2::system_clock::now();
      _woss = (pointer)0x0;
      poVar13 = (on_statement_executed_type *)&woss;
      mjs::interpreter::interpreter(&interpreter_,&h,es5,(on_statement_executed_type *)&woss);
      std::_Function_base::~_Function_base((_Function_base *)&woss);
      mjs::interpreter::eval(&res,&interpreter_,(statement *)local_278._M_dataplus._M_p);
      piVar4 = local_2f8;
      if (res.type_ != boolean) {
LAB_0012f67b:
        std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
        pwVar8 = std::operator<<((wostream *)&woss,"Unexpected result: ");
        mjs::to_string((mjs *)&local_2b8,&h,&res);
        wVar15 = mjs::string::view((string *)&local_2b8);
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar8,wVar15._M_str,wVar15._M_len)
        ;
        mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_2b8);
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::wstringbuf::str();
        wVar15._M_len._4_4_ = local_298._M_dataplus._M_p._4_4_;
        wVar15._M_len._0_4_ = local_298._M_dataplus._M_p._0_4_;
        wVar15._M_str = (wchar_t *)poVar13;
        mjs::unicode::utf16_to_utf8_abi_cxx11_
                  ((string *)&local_2b8,(unicode *)local_298._M_string_length,wVar15);
        std::runtime_error::runtime_error(prVar10,(string *)&local_2b8);
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar2 = mjs::value::boolean_value(&res);
      if (!bVar2) goto LAB_0012f67b;
      if (piVar4 != (int *)"N3mjs9gc_stringE") {
        pwVar8 = std::operator<<((wostream *)&std::wcerr,"Test ");
        *(undefined8 *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x10) = 4;
        pwVar8 = (wostream *)std::wostream::operator<<((wostream *)pwVar8,local_300);
        pwVar8 = std::operator<<(pwVar8," passed: ");
        lVar9 = *(long *)pwVar8;
        *(undefined8 *)(pwVar8 + *(long *)(lVar9 + -0x18) + 0x10) = 0x14;
        lVar9 = *(long *)(lVar9 + -0x18);
        *(uint *)(pwVar8 + lVar9 + 0x18) = *(uint *)(pwVar8 + lVar9 + 0x18) & 0xffffff4f | 0x20;
        pwVar8 = std::operator<<(pwVar8,pcVar1);
        *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
             *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) & 0xffffff4f | 0x80;
        pwVar8 = std::operator<<(pwVar8," ");
        pwVar8 = std::operator<<(pwVar8,tests[iVar14].description);
        std::operator<<(pwVar8," -- EXPECTED FAILURE\n");
        local_2fc = local_2fc + 1;
      }
      mjs::value::~value(&res);
      mjs::interpreter::~interpreter(&interpreter_);
      if ((statement *)local_278._M_dataplus._M_p != (statement *)0x0) {
        (**(code **)(*(long *)local_278._M_dataplus._M_p + 8))();
      }
      std::__cxx11::wstring::~wstring((wstring *)&code);
      lVar9 = std::chrono::_V2::system_clock::now();
      local_2f8 = (int *)((double)(lVar9 - lVar7) / 1000000000.0);
      if (1.0 < (double)local_2f8) {
        *(undefined8 *)(std::locale::~locale + *(long *)(std::wcout + -0x18)) = 4;
        pwVar8 = (wostream *)std::wostream::operator<<((wostream *)&std::wcout,local_300);
        pwVar8 = std::operator<<(pwVar8," ");
        *(undefined8 *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x10) = 10;
        pwVar8 = std::wostream::_M_insert<double>(((double)(lVar7 - lVar5) / 1000000000.0) * 1000.0)
        ;
        pwVar8 = std::operator<<(pwVar8," ");
        *(undefined8 *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x10) = 10;
        pwVar8 = std::wostream::_M_insert<double>((double)local_2f8 * 1000.0);
        pwVar8 = std::operator<<(pwVar8," ");
        pwVar8 = std::operator<<(pwVar8,tests[iVar14].id);
        std::operator<<(pwVar8," is slow\n");
      }
      iVar14 = local_300 + 1;
    }
    if (local_2fc != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&woss);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)&woss,local_2fc);
      std::operator<<(poVar11," unexpected result(s)");
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar10,(string *)&res);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::wstring::~wstring((wstring *)&helper_code);
    mjs::gc_heap::~gc_heap(&h);
  }
  return;
}

Assistant:

void test_main() {
    if (tested_version() != version::es5) {
        return;
    }

    constexpr int num_tests = sizeof(tests)/sizeof(*tests);
    gc_heap h{1<<20};
    int unexpected = 0;
    const auto helper_code = unicode::utf8_to_utf16(helper_functions) + L";";
    for (int i = 0; i < num_tests; ++i) {
        const auto& t = tests[i];
        const bool expect_failure = std::find(std::begin(expected_failures), std::end(expected_failures), i) != std::end(expected_failures);

        //std::wcout << std::setw(4) <<  (i+1) << "/" << num_tests << "\r" << std::flush;

        std::chrono::high_resolution_clock::time_point t0, t1, t2;

        try {
            if (h.use_percentage() > 50) {
                h.garbage_collect();
            }

            t0 = std::chrono::high_resolution_clock::now();

            auto code = unicode::utf8_to_utf16(t.prelude) +  helper_code + L"(function(){" + unicode::utf8_to_utf16(t.code) + L"})()";
            auto bs = parse(std::make_unique<source_file>(unicode::utf8_to_utf16(t.id), code, version::es5));

            t1 = std::chrono::high_resolution_clock::now();

            // Could be optimized to reuse interpreter but take to restore global object
            interpreter interpreter_{h, version::es5};
            auto res = interpreter_.eval(*bs);
            if (res.type() != value_type::boolean || !res.boolean_value()) {
                std::wostringstream woss;
                woss << "Unexpected result: " << to_string(h, res).view();
                throw std::runtime_error(unicode::utf16_to_utf8(woss.str()));
            }
            if (expect_failure) {
                std::wcerr << "Test " << std::setw(4) << i << " passed: " << std::setw(20) << std::left << t.id << std::right << " " <<  t.description << " -- EXPECTED FAILURE\n";
                ++unexpected;
            }
        } catch (const std::exception& e) {
            if (!expect_failure) {
                std::wcerr << "Test " << std::setw(4) << i << " failed: " << std::setw(20) << std::left << t.id << std::right << " " <<  t.description << "\n";
                std::wcerr << e.what() << "\n";
            }
            if (!expect_failure) {
                ++unexpected;
            }
        }

        t2 = std::chrono::high_resolution_clock::now();

        const auto d0 = std::chrono::duration<double>(t1-t0).count();
        const auto d1 = std::chrono::duration<double>(t2-t1).count();
        if (d1>1) {
            std::wcout << std::setw(4) << i << " " << std::setw(10) << d0*1000 << " " << std::setw(10) << d1*1000 << " " << t.id << " is slow\n";
        }
    }
    if (unexpected) {
        std::ostringstream oss;
        oss << unexpected << " unexpected result(s)";
        throw std::runtime_error(oss.str());
    }
}